

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::CondVar::Wakeup(CondVar *this,PerThreadSynch *w)

{
  ulong mu;
  long lVar1;
  Mutex *pMVar2;
  int c;
  SynchWaitParams *pSVar3;
  PerThreadSynch *pPVar4;
  bool bVar5;
  ThreadIdentity *pTVar6;
  SynchWaitParams *pSVar7;
  
  pSVar7 = w->waitp;
  if (((pSVar7->timeout).ns_ != 0) || (pMVar2 = pSVar7->cvmu, pMVar2 == (Mutex *)0x0)) {
    w->next = (PerThreadSynch *)0x0;
    (w->state)._M_i = kAvailable;
    AbslInternalPerThreadSemPost((ThreadIdentity *)w);
    return;
  }
  pSVar3 = w->waitp;
  if (pSVar3->cond != (Condition *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x947,"Check %s failed: %s","w->waitp->cond == nullptr",
               "Mutex::Fer while waiting on Condition",pSVar7);
    pSVar3 = w->waitp;
  }
  if ((pSVar3->timeout).ns_ != 0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x949,"Check %s failed: %s","!w->waitp->timeout.has_timeout()",
               "Mutex::Fer while in timed wait",pSVar7);
    pSVar3 = w->waitp;
  }
  if (pSVar3->cv_word != (atomic<long> *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x94b,"Check %s failed: %s","w->waitp->cv_word == nullptr",
               "Mutex::Fer with pending CondVar queueing",pSVar7);
  }
  c = 0;
  pTVar6 = (ThreadIdentity *)w;
  do {
    mu = (pMVar2->mu_).super___atomic_base<long>._M_i;
    pSVar7 = (((ThreadIdentity *)w)->per_thread_synch).waitp;
    if (((pSVar7->how != (MuHow)kSharedS | 8) & (uint)mu) == 0) {
      (((ThreadIdentity *)w)->per_thread_synch).next = (PerThreadSynch *)0x0;
      (((ThreadIdentity *)w)->per_thread_synch).state._M_i = kAvailable;
      AbslInternalPerThreadSemPost((ThreadIdentity *)w);
      return;
    }
    if ((mu & 0x44) == 0) {
      pPVar4 = Enqueue((PerThreadSynch *)0x0,pSVar7,mu,2);
      w = &pTVar6->per_thread_synch;
      if (pPVar4 == (PerThreadSynch *)0x0) {
        raw_logging_internal::RawLog
                  (kFatal,"mutex.cc",0x960,"Check %s failed: %s","new_h != nullptr","Enqueue failed"
                  );
        w = &pTVar6->per_thread_synch;
      }
      LOCK();
      bVar5 = mu == (pMVar2->mu_).super___atomic_base<long>._M_i;
      if (bVar5) {
        (pMVar2->mu_).super___atomic_base<long>._M_i = (ulong)((uint)mu & 0xbb) | (ulong)pPVar4 | 4;
      }
      UNLOCK();
      pTVar6 = (ThreadIdentity *)w;
      if (bVar5) {
        return;
      }
    }
    else if ((mu & 0x40) == 0) {
      LOCK();
      bVar5 = mu == (pMVar2->mu_).super___atomic_base<long>._M_i;
      if (bVar5) {
        (pMVar2->mu_).super___atomic_base<long>._M_i = mu | 0x44;
      }
      UNLOCK();
      if (bVar5) {
        pPVar4 = Enqueue((PerThreadSynch *)(mu & 0xffffffffffffff00),
                         (((ThreadIdentity *)w)->per_thread_synch).waitp,mu,2);
        if (pPVar4 == (PerThreadSynch *)0x0) {
          raw_logging_internal::RawLog
                    (kFatal,"mutex.cc",0x96b,"Check %s failed: %s","new_h != nullptr",
                     "Enqueue failed");
        }
        do {
          lVar1 = (pMVar2->mu_).super___atomic_base<long>._M_i;
          LOCK();
          bVar5 = lVar1 == (pMVar2->mu_).super___atomic_base<long>._M_i;
          if (bVar5) {
            (pMVar2->mu_).super___atomic_base<long>._M_i =
                 (ulong)((uint)lVar1 & 0xbb) | (ulong)pPVar4 | 4;
          }
          UNLOCK();
        } while (!bVar5);
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c,1);
  } while( true );
}

Assistant:

void CondVar::Wakeup(PerThreadSynch *w) {
  if (w->waitp->timeout.has_timeout() || w->waitp->cvmu == nullptr) {
    // The waiting thread only needs to observe "w->state == kAvailable" to be
    // released, we must cache "cvmu" before clearing "next".
    Mutex *mu = w->waitp->cvmu;
    w->next = nullptr;
    w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
    Mutex::IncrementSynchSem(mu, w);
  } else {
    w->waitp->cvmu->Fer(w);
  }
}